

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_6875f4::CodemodelConfig::DumpTarget
          (Value *__return_storage_ptr__,CodemodelConfig *this,cmGeneratorTarget *gt,ArrayIndex ti)

{
  cmFileAPI *this_00;
  string *psVar1;
  ulong uVar2;
  Value *pVVar3;
  cmLocalGenerator *lg;
  reference pvVar4;
  reference pvVar5;
  Value local_498;
  Value local_470;
  UInt local_444;
  undefined1 local_440 [4];
  ArrayIndex pi;
  Value local_418;
  ArrayIndex local_3ec;
  undefined1 local_3e8 [4];
  ArrayIndex di;
  Value local_3c8;
  Value local_3a0;
  Value local_378;
  undefined1 local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_318 [8];
  string prefix;
  Target t;
  ArrayIndex ti_local;
  cmGeneratorTarget *gt_local;
  CodemodelConfig *this_local;
  Value *target;
  
  Target::Target((Target *)((long)&prefix.field_2 + 8),gt,this->Config);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                 "target-",psVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_348,"-",this->Config);
    std::__cxx11::string::operator+=((string *)local_318,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_348);
  }
  local_349 = 0;
  this_00 = this->FileAPI;
  Target::Dump(&local_378,(Target *)((long)&prefix.field_2 + 8));
  cmFileAPI::MaybeJsonFile(__return_storage_ptr__,this_00,&local_378,(string *)local_318);
  Json::Value::~Value(&local_378);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  Json::Value::Value(&local_3a0,psVar1);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar3,&local_3a0);
  Json::Value::~Value(&local_3a0);
  TargetId((string *)local_3e8,gt,&this->TopBuild);
  Json::Value::Value(&local_3c8,(string *)local_3e8);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar3,&local_3c8);
  Json::Value::~Value(&local_3c8);
  std::__cxx11::string::~string((string *)local_3e8);
  lg = cmGeneratorTarget::GetLocalGenerator(gt);
  local_3ec = GetDirectoryIndex(this,lg);
  Json::Value::Value(&local_418,local_3ec);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"directoryIndex");
  Json::Value::operator=(pVVar3,&local_418);
  Json::Value::~Value(&local_418);
  pvVar4 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
           ::operator[](&this->Directories,(ulong)local_3ec);
  Json::Value::Value((Value *)local_440,ti);
  Json::Value::append(&pvVar4->TargetIndexes,(Value *)local_440);
  Json::Value::~Value((Value *)local_440);
  pvVar4 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
           ::operator[](&this->Directories,(ulong)local_3ec);
  local_444 = pvVar4->ProjectIndex;
  Json::Value::Value(&local_470,local_444);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"projectIndex");
  Json::Value::operator=(pVVar3,&local_470);
  Json::Value::~Value(&local_470);
  pvVar5 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
           ::operator[](&this->Projects,(ulong)local_444);
  Json::Value::Value(&local_498,ti);
  Json::Value::append(&pvVar5->TargetIndexes,&local_498);
  Json::Value::~Value(&local_498);
  local_349 = 1;
  std::__cxx11::string::~string((string *)local_318);
  Target::~Target((Target *)((long)&prefix.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpTarget(cmGeneratorTarget* gt,
                                        Json::ArrayIndex ti)
{
  Target t(gt, this->Config);
  std::string prefix = "target-" + gt->GetName();
  if (!this->Config.empty()) {
    prefix += "-" + this->Config;
  }
  Json::Value target = this->FileAPI.MaybeJsonFile(t.Dump(), prefix);
  target["name"] = gt->GetName();
  target["id"] = TargetId(gt, this->TopBuild);

  // Cross-reference directory containing target.
  Json::ArrayIndex di = this->GetDirectoryIndex(gt->GetLocalGenerator());
  target["directoryIndex"] = di;
  this->Directories[di].TargetIndexes.append(ti);

  // Cross-reference project containing target.
  Json::ArrayIndex pi = this->Directories[di].ProjectIndex;
  target["projectIndex"] = pi;
  this->Projects[pi].TargetIndexes.append(ti);

  return target;
}